

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O0

void ImGui_ImplGlfwGL3_KeyCallback(GLFWwindow *param_1,int key,int param_3,int action,int mods)

{
  ImGuiIO *pIVar1;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  ImGuiIO *io;
  int mods_local;
  int action_local;
  int param_2_local;
  int key_local;
  GLFWwindow *param_0_local;
  
  pIVar1 = ImGui::GetIO();
  if (action == 1) {
    pIVar1->KeysDown[key] = true;
  }
  if (action == 0) {
    pIVar1->KeysDown[key] = false;
  }
  local_29 = 1;
  if ((pIVar1->KeysDown[0x155] & 1U) == 0) {
    local_29 = pIVar1->KeysDown[0x159];
  }
  pIVar1->KeyCtrl = (bool)(local_29 & 1);
  local_2a = 1;
  if ((pIVar1->KeysDown[0x154] & 1U) == 0) {
    local_2a = pIVar1->KeysDown[0x158];
  }
  pIVar1->KeyShift = (bool)(local_2a & 1);
  local_2b = 1;
  if ((pIVar1->KeysDown[0x156] & 1U) == 0) {
    local_2b = pIVar1->KeysDown[0x15a];
  }
  pIVar1->KeyAlt = (bool)(local_2b & 1);
  local_2c = 1;
  if ((pIVar1->KeysDown[0x157] & 1U) == 0) {
    local_2c = pIVar1->KeysDown[0x15b];
  }
  pIVar1->KeySuper = (bool)(local_2c & 1);
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_KeyCallback(GLFWwindow*, int key, int, int action, int mods)
{
    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    (void)mods; // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
}